

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O3

int bssl::VerifyNameMatchUnicodeConversionTest_UnicodeConversionsAreEqual_Test::AddToRegistry(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<bssl::VerifyNameMatchUnicodeConversionTest> *this_01;
  TestMetaFactoryBase<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>
  *meta_factory;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"VerifyNameMatchUnicodeConversionTest","");
  local_e0 = &local_d0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_name_match_unittest.cc"
             ,"");
  paVar2 = &local_58.file.field_2;
  if (local_e0 == &local_d0) {
    local_58.file.field_2._8_8_ = local_d0._8_8_;
    local_58.file._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_58.file._M_dataplus._M_p = (pointer)local_e0;
  }
  local_58.file.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
  local_58.file.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
  local_58.file._M_string_length = local_d8;
  local_d8 = 0;
  local_d0._M_local_buf[0] = '\0';
  local_58.line = 0x12d;
  local_e0 = &local_d0;
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<bssl::VerifyNameMatchUnicodeConversionTest>
                      (this_00,&local_a0,&local_58);
  meta_factory = (TestMetaFactoryBase<std::tuple<const_char_*,_std::tuple<const_char_*,_const_char_*>_>_>
                  *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_006d23a0;
  local_c0 = &local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_name_match_unittest.cc"
             ,"");
  paVar1 = &local_80.file.field_2;
  if (local_c0 == &local_b0) {
    local_80.file.field_2._8_8_ = local_b0._8_8_;
    local_80.file._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_80.file._M_dataplus._M_p = (pointer)local_c0;
  }
  local_80.file.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
  local_80.file.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
  local_80.file._M_string_length = local_b8;
  local_b8 = 0;
  local_b0._M_local_buf[0] = '\0';
  local_80.line = 0x12d;
  local_c0 = &local_b0;
  testing::internal::ParameterizedTestSuiteInfo<bssl::VerifyNameMatchUnicodeConversionTest>::
  AddTestPattern(this_01,"VerifyNameMatchUnicodeConversionTest","UnicodeConversionsAreEqual",
                 meta_factory,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.file._M_dataplus._M_p,local_80.file.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(local_d0._M_allocated_capacity._1_7_,local_d0._M_local_buf[0])
                             + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

TEST_P(VerifyNameMatchUnicodeConversionTest, UnicodeConversionsAreEqual) {
  std::string der_1;
  ASSERT_TRUE(LoadTestData(prefix(), value_type_1(), "unmangled", &der_1));
  std::string der_2;
  ASSERT_TRUE(LoadTestData(prefix(), value_type_2(), "unmangled", &der_2));
  EXPECT_TRUE(VerifyNameMatch(SequenceValueFromString(der_1),
                              SequenceValueFromString(der_2)));
}